

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,CommaSeparatedList *l)

{
  long lVar1;
  pool_ref<soul::AST::Expression> *i;
  pool_ref<soul::AST::Expression> *e;
  
  e = (l->items).items;
  for (lVar1 = (l->items).numActive << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    replaceExpression(this,e);
    e = e + 1;
  }
  return &l->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::CommaSeparatedList& l)
    {
        for (auto& i : l.items)
            replaceExpression (i);

        return l;
    }